

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::CreateJob
          (Error *__return_storage_ptr__,JobManager *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr,uint64_t aXpanId)

{
  Interpreter *aInterpreter;
  pointer pbVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *p_Var2;
  const_iterator cVar3;
  Job *this_00;
  char *begin;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  Job *job;
  char *pcStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  type *local_c8;
  code *local_c0;
  CommissionerAppPtr *local_b8;
  uint64_t local_b0;
  JobEvaluator eval;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_70;
  string local_50;
  
  eval.super__Function_base._M_manager = (_Manager_type)0x0;
  eval._M_invoker = (_Invoker_type)0x0;
  eval.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  eval.super__Function_base._M_functor._8_8_ = 0;
  utils::ToLower((string *)&job,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  p_Var2 = Interpreter::mJobEvaluatorMap_abi_cxx11_;
  local_b8 = aCommissioner;
  local_b0 = aXpanId;
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
          ::find(Interpreter::mJobEvaluatorMap_abi_cxx11_,(key_type *)&job);
  std::__cxx11::string::~string((string *)&job);
  if ((_Rb_tree_header *)cVar3._M_node == &(p_Var2->_M_impl).super__Rb_tree_header) {
    job = (Job *)CONCAT44(job._4_4_,0xd);
    pcStack_e0 = "{} not eligible for job";
    local_d8._M_allocated_capacity = 0x17;
    local_d8._8_8_ = 0x100000000;
    local_c0 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar4 = "{} not eligible for job";
    local_c8 = (type *)&job;
    while (begin = pcVar4, begin != "") {
      pcVar4 = begin + 1;
      if (*begin == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&job);
      }
    }
    pbVar1 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    job = (Job *)(pbVar1->_M_dataplus)._M_p;
    pcStack_e0 = (char *)pbVar1->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x17;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&job;
    ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"{} not eligible for job",fmt,args);
    __return_storage_ptr__->mCode = kInvalidCommand;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::
    function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator=(&eval,(function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                       *)(cVar3._M_node + 2));
    this_00 = (Job *)operator_new(0xa0);
    aInterpreter = this->mInterpreter;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,aExpr);
    std::
    function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function(&local_70,&eval);
    Job::Job(this_00,aInterpreter,local_b8,&local_88,&local_70,local_b0);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    job = this_00;
    std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::push_back
              (&this->mJobPool,&job);
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  std::_Function_base::~_Function_base(&eval.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::CreateJob(CommissionerAppPtr &aCommissioner, const Interpreter::Expression &aExpr, uint64_t aXpanId)
{
    Interpreter::JobEvaluator eval;
    auto                      mapItem = Interpreter::mJobEvaluatorMap.find(utils::ToLower(aExpr[0]));

    if (mapItem == Interpreter::mJobEvaluatorMap.end())
    {
        return ERROR_INVALID_COMMAND("{} not eligible for job", aExpr[0]);
    }
    eval     = mapItem->second;
    Job *job = new Job(mInterpreter, aCommissioner, aExpr, eval, aXpanId);
    mJobPool.push_back(job);

    return ERROR_NONE;
}